

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNativeStandardFile.cpp
# Opt level: O0

ssize_t __thiscall
chatra::emb::io::ReadStandardFile::write(ReadStandardFile *this,int __fd,void *__buf,size_t __n)

{
  UnsupportedOperationException *this_00;
  size_t length_local;
  uint8_t *src_local;
  ReadStandardFile *this_local;
  
  this_00 = (UnsupportedOperationException *)__cxa_allocate_exception(0x28);
  memset(this_00,0,0x28);
  UnsupportedOperationException::UnsupportedOperationException(this_00);
  __cxa_throw(this_00,&UnsupportedOperationException::typeinfo,
              UnsupportedOperationException::~UnsupportedOperationException);
}

Assistant:

size_t write(const uint8_t* src, size_t length) override {
		(void)src;
		(void)length;
		throw UnsupportedOperationException();
	}